

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O0

void __thiscall
kj::Canceler::AdapterImpl<capnp::Capability::Client>::cancel
          (AdapterImpl<capnp::Capability::Client> *this,Exception *e)

{
  PromiseFulfiller<capnp::Capability::Client> *pPVar1;
  Exception *pEVar2;
  Promise<void> local_20;
  Exception *local_18;
  Exception *e_local;
  AdapterImpl<capnp::Capability::Client> *this_local;
  
  pPVar1 = this->fulfiller;
  local_18 = e;
  e_local = (Exception *)this;
  pEVar2 = mv<kj::Exception>(e);
  (**(pPVar1->super_PromiseRejector)._vptr_PromiseRejector)(pPVar1,pEVar2);
  Promise<void>::Promise(&local_20,(void *)0x0);
  Promise<void>::operator=(&this->inner,&local_20);
  Promise<void>::~Promise(&local_20);
  return;
}

Assistant:

void cancel(Exception&& e) override {
      fulfiller.reject(kj::mv(e));
      inner = nullptr;
    }